

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

AtomicWait * __thiscall
wasm::Builder::makeAtomicWait
          (Builder *this,Expression *ptr,Expression *expected,Expression *timeout,Type expectedType,
          Address offset,Name memory)

{
  AtomicWait *this_00;
  AtomicWait *wait;
  Expression *timeout_local;
  Expression *expected_local;
  Expression *ptr_local;
  Builder *this_local;
  Address offset_local;
  Type expectedType_local;
  
  this_00 = MixedArena::alloc<wasm::AtomicWait>(&this->wasm->allocator);
  (this_00->offset).addr = offset.addr;
  this_00->ptr = ptr;
  this_00->expected = expected;
  this_00->timeout = timeout;
  (this_00->expectedType).id = expectedType.id;
  AtomicWait::finalize(this_00);
  wasm::Name::operator=(&this_00->memory,&memory);
  return this_00;
}

Assistant:

AtomicWait* makeAtomicWait(Expression* ptr,
                             Expression* expected,
                             Expression* timeout,
                             Type expectedType,
                             Address offset,
                             Name memory) {
    auto* wait = wasm.allocator.alloc<AtomicWait>();
    wait->offset = offset;
    wait->ptr = ptr;
    wait->expected = expected;
    wait->timeout = timeout;
    wait->expectedType = expectedType;
    wait->finalize();
    wait->memory = memory;
    return wait;
  }